

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O0

void __thiscall cppcms::http::response::io_mode(response *this,io_mode_type mode)

{
  cppcms_error *this_00;
  undefined4 in_ESI;
  long in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator local_31;
  string local_30 [48];
  
  if ((*(uint *)(in_RDI + 0x1c) >> 1 & 1) != 0) {
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"Can\'t set mode after requesting output stream",&local_31);
    cppcms_error::cppcms_error(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  *(undefined4 *)(in_RDI + 0x18) = in_ESI;
  return;
}

Assistant:

void response::io_mode(response::io_mode_type mode)
{
	if(ostream_requested_)
		throw cppcms_error("Can't set mode after requesting output stream");
	io_mode_=mode;
}